

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

bdecode_node * __thiscall
libtorrent::bdecode_node::list_at(bdecode_node *__return_storage_ptr__,bdecode_node *this,int i)

{
  int iVar1;
  int iVar2;
  int idx;
  
  iVar2 = this->m_last_index;
  if (iVar2 == -1 || i < iVar2) {
    idx = this->m_token_idx + 1;
    iVar2 = 0;
  }
  else {
    idx = this->m_last_token;
  }
  iVar1 = i - iVar2;
  if (iVar1 != 0 && iVar2 <= i) {
    do {
      idx = idx + (*(uint *)&this->m_root_tokens[idx].field_0x4 & 0x1fffffff);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  this->m_last_token = idx;
  this->m_last_index = i;
  bdecode_node(__return_storage_ptr__,this->m_root_tokens,this->m_buffer,this->m_buffer_size,idx);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode_node::list_at(int i) const
	{
		TORRENT_ASSERT(type() == list_t);
		TORRENT_ASSERT(i >= 0);

		// make sure this is a list.
		bdecode_token const* tokens = m_root_tokens;

		// this is the first item
		int token = m_token_idx + 1;
		int item = 0;

		// do we have a lookup cached?
		if (m_last_index <= i && m_last_index != -1)
		{
			token = m_last_token;
			item = m_last_index;
		}

		while (item < i)
		{
			token += tokens[token].next_item;
			++item;

			// index 'i' out of range
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);
		}

		m_last_token = token;
		m_last_index = i;

		return bdecode_node(tokens, m_buffer, m_buffer_size, token);
	}